

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O0

void * cache_alloc(cache *c)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *locks;
  char *current_page;
  int new_page;
  size_t entries_per_page;
  size_t j;
  size_t i;
  cache *c_local;
  
  uVar3 = c->page_size / (c->entry_size + 1);
  pthread_lock_mutex(&c->mutex);
  j = 0;
  do {
    if (c->page_count <= j) {
      iVar2 = add_page(c);
      if (iVar2 < 0) {
        pthread_unlock_mutex(&c->mutex);
        c_local = (cache *)0x0;
      }
      else {
        c_local = (cache *)c->pages[iVar2];
        *(char *)((long)&c_local->entry_init + uVar3 * c->entry_size) = '\x01';
        pthread_unlock_mutex(&c->mutex);
      }
      return c_local;
    }
    pcVar1 = c->pages[j];
    lVar4 = uVar3 * c->entry_size;
    for (entries_per_page = 0; entries_per_page < uVar3; entries_per_page = entries_per_page + 1) {
      if (pcVar1[entries_per_page + lVar4] == '\0') {
        pcVar1[entries_per_page + lVar4] = '\x01';
        pthread_unlock_mutex(&c->mutex);
        return pcVar1 + entries_per_page * c->entry_size;
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

void *
cache_alloc( struct cache *c ) {
  size_t i;
  size_t j;
  size_t entries_per_page;
  int new_page;
  char *current_page;
  char *locks;

  entries_per_page = c->page_size / ( c->entry_size + sizeof( char ) );

  config_lock_mutex( &c->mutex );

  for( i = 0; i < c->page_count; i++ ) {
    current_page = c->pages[i];
    locks = current_page + ( entries_per_page * c->entry_size );
    for( j = 0; j < entries_per_page; j++ ) {
      if( locks[j] == 0 ) {
        locks[j] = 1;
        config_unlock_mutex( &c->mutex );
        return current_page + ( j * c->entry_size );
      }
    }
  }

  new_page = add_page( c );
  if( new_page < 0 ) {
    config_unlock_mutex( &c->mutex );
    return NULL;
  }

  current_page = c->pages[new_page];
  locks = current_page + ( entries_per_page * c->entry_size );
  locks[0] = 1;
  config_unlock_mutex( &c->mutex );
  return current_page;
}